

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::getInputs
          (ShaderAtomicAndCase *this,int numValues,int stride,void *inputs)

{
  deUint32 dVar1;
  uint uVar2;
  int iVar3;
  char *str;
  uint local_78;
  int local_74;
  int local_60;
  int localNdx;
  deUint32 groupMask;
  int groupOffset;
  int groupNdx;
  deUint32 valueMask;
  int numBits;
  int numWorkGroups;
  undefined1 local_30 [4];
  int workGroupSize;
  Random rnd;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicAndCase *this_local;
  
  rnd.m_rnd._8_8_ = inputs;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_30,dVar1);
  uVar2 = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_HIGHP) {
    local_74 = 0x20;
  }
  else {
    local_74 = 8;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_MEDIUMP) {
      local_74 = 0x10;
    }
  }
  if (local_74 == 0x20) {
    local_78 = 0xffffffff;
  }
  else {
    local_78 = (1 << ((byte)local_74 & 0x1f)) - 1;
  }
  for (groupMask = 0; (int)groupMask < numValues / (int)uVar2; groupMask = groupMask + 1) {
    iVar3 = de::Random::getInt((Random *)local_30,0,local_74 + -2);
    for (local_60 = 0; local_60 < (int)uVar2; local_60 = local_60 + 1) {
      dVar1 = de::Random::getUint32((Random *)local_30);
      *(deUint32 *)(rnd.m_rnd._8_8_ + (long)(int)(stride * (groupMask * uVar2 + local_60))) =
           dVar1 & local_78 | 1 << ((byte)iVar3 & 0x1f);
    }
  }
  de::Random::~Random((Random *)local_30);
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupMask		= 1<<rnd.getInt(0, numBits-2); // One bit is always set.

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = (rnd.getUint32() & valueMask) | groupMask;
		}
	}